

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3sOcclusionQueryTests.cpp
# Opt level: O2

int __thiscall
deqp::gles3::Stress::OcclusionQueryStressCase::init
          (OcclusionQueryStressCase *this,EVP_PKEY_CTX *ctx)

{
  RenderContext *renderCtx;
  TestContext *this_00;
  GLenum err;
  int extraout_EAX;
  ShaderProgram *this_01;
  TestError *this_02;
  allocator<char> local_12a;
  allocator<char> local_129;
  string local_128;
  string local_108;
  ProgramSources local_e8;
  
  this_01 = (ShaderProgram *)operator_new(0xd0);
  renderCtx = ((this->super_TestCase).m_context)->m_renderCtx;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_108,
             "#version 300 es\nlayout(location = 0) in mediump vec4 a_position;\n\nvoid main (void)\n{\n\tgl_Position = a_position;\n}\n"
             ,&local_129);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_128,
             "#version 300 es\nlayout(location = 0) out mediump vec4 dEQP_FragColor;\nuniform mediump vec4 u_color;\n\nvoid main (void)\n{\n\tmediump float depth_gradient = gl_FragCoord.z;\n\tmediump float bias = 0.1;\n\tdEQP_FragColor = vec4(u_color.xyz * (depth_gradient + bias), 1.0);\n}\n"
             ,&local_12a);
  glu::makeVtxFragSources(&local_e8,&local_108,&local_128);
  glu::ShaderProgram::ShaderProgram(this_01,renderCtx,&local_e8);
  this->m_program = this_01;
  glu::ProgramSources::~ProgramSources(&local_e8);
  std::__cxx11::string::~string((string *)&local_128);
  std::__cxx11::string::~string((string *)&local_108);
  this_00 = (this->super_TestCase).super_TestCase.super_TestNode.m_testCtx;
  if ((this->m_program->m_program).m_info.linkOk != false) {
    tcu::TestContext::setTestResult(this_00,QP_TEST_RESULT_PASS,"Pass");
    err = glwGetError();
    glu::checkError(err,"Case initialization finished",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles3/stress/es3sOcclusionQueryTests.cpp"
                    ,0x88);
    return extraout_EAX;
  }
  glu::operator<<(this_00->m_log,this->m_program);
  this_02 = (TestError *)__cxa_allocate_exception(0x38);
  tcu::TestError::TestError
            (this_02,"Failed to compile shader program",(char *)0x0,
             "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles3/stress/es3sOcclusionQueryTests.cpp"
             ,0x84);
  __cxa_throw(this_02,&tcu::TestError::typeinfo,tcu::Exception::~Exception);
}

Assistant:

void OcclusionQueryStressCase::init (void)
{
	const char*	vertShaderSource =
				"#version 300 es\n"
				"layout(location = 0) in mediump vec4 a_position;\n"
				"\n"
				"void main (void)\n"
				"{\n"
				"	gl_Position = a_position;\n"
				"}\n";

	const char* fragShaderSource =
				"#version 300 es\n"
				"layout(location = 0) out mediump vec4 dEQP_FragColor;\n"
				"uniform mediump vec4 u_color;\n"
				"\n"
				"void main (void)\n"
				"{\n"
				"	mediump float depth_gradient = gl_FragCoord.z;\n"
				"	mediump float bias = 0.1;\n"
				"	dEQP_FragColor = vec4(u_color.xyz * (depth_gradient + bias), 1.0);\n"
				"}\n";

	DE_ASSERT(!m_program);
	m_program = new glu::ShaderProgram(m_context.getRenderContext(), glu::makeVtxFragSources(vertShaderSource, fragShaderSource));

	if (!m_program->isOk())
	{
		m_testCtx.getLog() << *m_program;
		TCU_FAIL("Failed to compile shader program");
	}

	m_testCtx.setTestResult(QP_TEST_RESULT_PASS, "Pass"); // Initialize test result to pass.
	GLU_CHECK_MSG ("Case initialization finished");
}